

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O3

void oonf_timer_set_ext(oonf_timer_instance *timer,uint64_t first,uint64_t interval)

{
  uint32_t *puVar1;
  uint *dst;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  oonf_log_source source;
  int iVar5;
  uint64_t uVar6;
  char *pcVar7;
  uint64_t uVar8;
  isonumber_str iStack_60;
  
  if (first == 0) {
    oonf_timer_stop(timer);
    return;
  }
  if (timer->_clock == 0) {
    (timer->_node).key = timer;
    puVar1 = &timer->class->_stat_usage;
    *puVar1 = *puVar1 + 1;
  }
  else {
    avl_remove(&_timer_tree,&timer->_node);
    puVar1 = &timer->class->_stat_changes;
    *puVar1 = *puVar1 + 1;
  }
  dst = &timer->_random;
  if (timer->_random == 0) {
    iVar5 = os_core_linux_get_random(dst,4);
    if (iVar5 != 0) {
      if ((log_global_mask[_oonf_timer_subsystem.logging] & 4) != 0) {
        oonf_log(LOG_SEVERITY_WARN,_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0xb3,
                 (void *)0x0,0,"Could not get random data");
      }
      *dst = 0;
    }
  }
  bVar2 = timer->jitter_pct;
  uVar8 = first;
  if (bVar2 != 0) {
    uVar4 = (ulong)*dst / (0xffffffff / (ulong)bVar2);
    uVar8 = first - (uVar4 * first) / 100;
    if ((log_global_mask[_oonf_timer_subsystem.logging] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0x15d,
               (void *)0x0,0,"TIMER: jitter %u%% (%u) rel_time %lums to %lums\n",(ulong)bVar2,uVar4,
               first,uVar8);
    }
  }
  uVar6 = oonf_clock_getNow();
  timer->_clock = ((uVar6 + uVar8 + 100) / 100) * 100;
  uVar8 = 0;
  if (timer->class->periodic != false) {
    uVar8 = interval;
  }
  timer->_period = uVar8;
  avl_insert(&_timer_tree,&timer->_node);
  source = _oonf_timer_subsystem.logging;
  if ((log_global_mask[_oonf_timer_subsystem.logging] & 1) != 0) {
    pcVar3 = timer->class->name;
    pcVar7 = oonf_clock_toClockString(&iStack_60,first);
    oonf_log(LOG_SEVERITY_DEBUG,source,"src/base/oonf_timer.c",0xc2,(void *)0x0,0,
             "TIMER: start timer \'%s\' firing in %s (%lu)\n",pcVar3,pcVar7,timer->_clock);
  }
  return;
}

Assistant:

void
oonf_timer_set_ext(struct oonf_timer_instance *timer, uint64_t first, uint64_t interval) {
  if (first == 0) {
    /* No good future time provided, kill it. */
    oonf_timer_stop(timer);
  }
  else {
    /* Start or restart the timer */
    oonf_timer_start_ext(timer, first, interval);
  }
}